

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O3

int make_pack(mixed_encoding encoding,int channels,mixed_pack *pack)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t size;
  char *buffer;
  uint local_1c;
  long local_18;
  
  pack->encoding = encoding;
  pack->channels = (mixed_channel_t)channels;
  pack->samplerate = 48000;
  iVar1 = mixed_make_pack(500,pack);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    local_1c = 0xffffffff;
    mixed_pack_request_write(&local_18,&local_1c,pack);
    if (local_1c == 0) {
      uVar3 = 0;
    }
    else {
      uVar4 = 0;
      do {
        iVar2 = rand();
        iVar1 = iVar2 + 0x7f;
        if (-1 < iVar2) {
          iVar1 = iVar2;
        }
        *(byte *)(local_18 + uVar4) = (char)iVar2 - ((byte)iVar1 & 0x80);
        uVar4 = uVar4 + 1;
        uVar3 = (ulong)local_1c;
      } while (uVar4 < uVar3);
    }
    mixed_pack_finish_write(uVar3,pack);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int make_pack(enum mixed_encoding encoding, int channels, struct mixed_pack *pack){
  int frames = 500;
  pack->encoding = encoding;
  pack->channels = channels;
  pack->samplerate = 48000;
  if(!mixed_make_pack(frames, pack))
    return 0;
  char *buffer;
  uint32_t size = UINT32_MAX;
  mixed_pack_request_write((void**)&buffer, &size, pack);
  for(uint32_t i=0; i<size; ++i)
    buffer[i] = rand()%128;
  mixed_pack_finish_write(size, pack);
  return 1;
}